

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar8 = 0;
  }
  else {
    sVar8 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      sVar2 = ((this->name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      sVar2 = ((this->extendee_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 4) != 0) {
      sVar2 = ((this->type_name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 8) != 0) {
      sVar2 = ((this->default_value_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 0x10) != 0) {
      sVar2 = ((this->json_name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 0x20) != 0) {
      sVar5 = FieldOptions::ByteSizeLong(this->options_);
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
      uVar4 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar4 & 0x40) != 0) {
      if (this->number_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->number_ | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
    if ((char)uVar4 < '\0') {
      if (this->oneof_index_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->oneof_index_ | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
  }
  if ((uVar4 & 0x300) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      if (this->label_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->label_ | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
    if ((uVar4 >> 9 & 1) != 0) {
      if (this->type_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar4 = this->type_ | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
  }
  this->_cached_size_ = (int)sVar8;
  return sVar8;
}

Assistant:

size_t FieldDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string extendee = 2;
    if (has_extendee()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->extendee());
    }

    // optional string type_name = 6;
    if (has_type_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type_name());
    }

    // optional string default_value = 7;
    if (has_default_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->default_value());
    }

    // optional string json_name = 10;
    if (has_json_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->json_name());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->options_);
    }

    // optional int32 number = 3;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional int32 oneof_index = 9;
    if (has_oneof_index()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->oneof_index());
    }

  }
  if (_has_bits_[8 / 32] & 768u) {
    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}